

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockNamedValue.cpp
# Opt level: O2

bool __thiscall MockNamedValue::equals(MockNamedValue *this,MockNamedValue *p)

{
  SimpleString *left;
  uint uVar1;
  MockNamedValueComparator *pMVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  bool bVar6;
  SimpleString SStack_48;
  SimpleString local_38;
  
  left = &this->type_;
  SimpleString::SimpleString(&SStack_48,"long int");
  bVar3 = operator==(left,&SStack_48);
  if (bVar3) {
    SimpleString::SimpleString(&local_38,"int");
    bVar3 = operator==(&p->type_,&local_38);
    SimpleString::~SimpleString(&local_38);
    SimpleString::~SimpleString(&SStack_48);
    if (!bVar3) goto LAB_00127225;
LAB_00127213:
    uVar5 = (ulong)(p->value_).intValue_;
    goto LAB_00127217;
  }
  SimpleString::~SimpleString(&SStack_48);
LAB_00127225:
  SimpleString::SimpleString(&SStack_48,"int");
  bVar3 = operator==(left,&SStack_48);
  if (bVar3) {
    SimpleString::SimpleString(&local_38,"long int");
    bVar3 = operator==(&p->type_,&local_38);
    SimpleString::~SimpleString(&local_38);
    SimpleString::~SimpleString(&SStack_48);
    if (!bVar3) goto LAB_00127296;
LAB_0012727e:
    uVar5 = (ulong)(this->value_).intValue_;
    goto LAB_00127282;
  }
  SimpleString::~SimpleString(&SStack_48);
LAB_00127296:
  SimpleString::SimpleString(&SStack_48,"unsigned int");
  bVar3 = operator==(left,&SStack_48);
  if (bVar3) {
    SimpleString::SimpleString(&local_38,"int");
    bVar3 = operator==(&p->type_,&local_38);
    SimpleString::~SimpleString(&local_38);
    SimpleString::~SimpleString(&SStack_48);
    if (bVar3) {
      bVar3 = -1 < (p->value_).intValue_;
      bVar6 = (this->value_).intValue_ == (p->value_).intValue_;
      goto LAB_0012753d;
    }
  }
  else {
    SimpleString::~SimpleString(&SStack_48);
  }
  SimpleString::SimpleString(&SStack_48,"int");
  bVar3 = operator==(left,&SStack_48);
  if (bVar3) {
    SimpleString::SimpleString(&local_38,"unsigned int");
    bVar3 = operator==(&p->type_,&local_38);
    SimpleString::~SimpleString(&local_38);
    SimpleString::~SimpleString(&SStack_48);
    if (bVar3) {
      bVar3 = -1 < (this->value_).intValue_;
      bVar6 = (this->value_).intValue_ == (p->value_).intValue_;
      goto LAB_0012753d;
    }
  }
  else {
    SimpleString::~SimpleString(&SStack_48);
  }
  SimpleString::SimpleString(&SStack_48,"unsigned long int");
  bVar3 = operator==(left,&SStack_48);
  if (bVar3) {
    SimpleString::SimpleString(&local_38,"int");
    bVar3 = operator==(&p->type_,&local_38);
    SimpleString::~SimpleString(&local_38);
    SimpleString::~SimpleString(&SStack_48);
    if (!bVar3) goto LAB_001273ee;
LAB_001273d3:
    bVar3 = -1 < (p->value_).intValue_;
    uVar5 = (ulong)(uint)(p->value_).intValue_;
LAB_001273dd:
    bVar6 = (this->value_).longIntValue_ == uVar5;
    goto LAB_0012753d;
  }
  SimpleString::~SimpleString(&SStack_48);
LAB_001273ee:
  SimpleString::SimpleString(&SStack_48,"int");
  bVar3 = operator==(left,&SStack_48);
  if (bVar3) {
    SimpleString::SimpleString(&local_38,"unsigned long int");
    bVar3 = operator==(&p->type_,&local_38);
    SimpleString::~SimpleString(&local_38);
    SimpleString::~SimpleString(&SStack_48);
    if (!bVar3) goto LAB_00127463;
LAB_00127447:
    bVar3 = -1 < (this->value_).intValue_;
    bVar6 = (p->value_).longIntValue_ == (ulong)(uint)(this->value_).intValue_;
    goto LAB_0012753d;
  }
  SimpleString::~SimpleString(&SStack_48);
LAB_00127463:
  SimpleString::SimpleString(&SStack_48,"unsigned int");
  bVar3 = operator==(left,&SStack_48);
  if (bVar3) {
    SimpleString::SimpleString(&local_38,"long int");
    bVar3 = operator==(&p->type_,&local_38);
    SimpleString::~SimpleString(&local_38);
    SimpleString::~SimpleString(&SStack_48);
    if (!bVar3) goto LAB_001274d4;
LAB_001274bc:
    uVar5 = (p->value_).longIntValue_;
    uVar1 = (this->value_).unsignedIntValue_;
  }
  else {
    SimpleString::~SimpleString(&SStack_48);
LAB_001274d4:
    SimpleString::SimpleString(&SStack_48,"long int");
    bVar3 = operator==(left,&SStack_48);
    if (!bVar3) {
      SimpleString::~SimpleString(&SStack_48);
LAB_00127559:
      SimpleString::SimpleString(&SStack_48,"unsigned int");
      bVar3 = operator==(left,&SStack_48);
      if (bVar3) {
        SimpleString::SimpleString(&local_38,"unsigned long int");
        bVar3 = operator==(&p->type_,&local_38);
        SimpleString::~SimpleString(&local_38);
        SimpleString::~SimpleString(&SStack_48);
        if (!bVar3) goto LAB_001275c3;
LAB_001275b2:
        uVar5 = (ulong)(this->value_).unsignedIntValue_;
LAB_00127282:
        return (p->value_).longIntValue_ == uVar5;
      }
      SimpleString::~SimpleString(&SStack_48);
LAB_001275c3:
      SimpleString::SimpleString(&SStack_48,"unsigned long int");
      bVar3 = operator==(left,&SStack_48);
      if (bVar3) {
        SimpleString::SimpleString(&local_38,"unsigned int");
        bVar3 = operator==(&p->type_,&local_38);
        SimpleString::~SimpleString(&local_38);
        SimpleString::~SimpleString(&SStack_48);
        if (!bVar3) goto LAB_0012762c;
LAB_0012761c:
        uVar5 = (ulong)(p->value_).unsignedIntValue_;
LAB_00127217:
        return (this->value_).longIntValue_ == uVar5;
      }
      SimpleString::~SimpleString(&SStack_48);
LAB_0012762c:
      SimpleString::SimpleString(&SStack_48,"long int");
      bVar3 = operator==(left,&SStack_48);
      if (!bVar3) {
        SimpleString::~SimpleString(&SStack_48);
LAB_001276a0:
        SimpleString::SimpleString(&SStack_48,"unsigned long int");
        bVar3 = operator==(left,&SStack_48);
        if (bVar3) {
          SimpleString::SimpleString(&local_38,"long int");
          bVar3 = operator==(&p->type_,&local_38);
          SimpleString::~SimpleString(&local_38);
          SimpleString::~SimpleString(&SStack_48);
          if (!bVar3) goto LAB_00127710;
LAB_001276f9:
          uVar5 = (p->value_).longIntValue_;
          bVar3 = -1 < (long)uVar5;
          goto LAB_001273dd;
        }
        SimpleString::~SimpleString(&SStack_48);
LAB_00127710:
        SimpleString::SimpleString(&SStack_48,"long long int");
        bVar3 = operator==(left,&SStack_48);
        if (bVar3) {
          SimpleString::SimpleString(&local_38,"int");
          bVar3 = operator==(&p->type_,&local_38);
          SimpleString::~SimpleString(&local_38);
          SimpleString::~SimpleString(&SStack_48);
          if (bVar3) goto LAB_00127213;
        }
        else {
          SimpleString::~SimpleString(&SStack_48);
        }
        SimpleString::SimpleString(&SStack_48,"int");
        bVar3 = operator==(left,&SStack_48);
        if (bVar3) {
          SimpleString::SimpleString(&local_38,"long long int");
          bVar3 = operator==(&p->type_,&local_38);
          SimpleString::~SimpleString(&local_38);
          SimpleString::~SimpleString(&SStack_48);
          if (bVar3) goto LAB_0012727e;
        }
        else {
          SimpleString::~SimpleString(&SStack_48);
        }
        SimpleString::SimpleString(&SStack_48,"long long int");
        bVar3 = operator==(left,&SStack_48);
        if (bVar3) {
          SimpleString::SimpleString(&local_38,"long int");
          bVar3 = operator==(&p->type_,&local_38);
          SimpleString::~SimpleString(&local_38);
          SimpleString::~SimpleString(&SStack_48);
          if (bVar3) goto LAB_0012789a;
        }
        else {
          SimpleString::~SimpleString(&SStack_48);
        }
        SimpleString::SimpleString(&SStack_48,"long int");
        bVar3 = operator==(left,&SStack_48);
        if (bVar3) {
          SimpleString::SimpleString(&local_38,"long long int");
          bVar3 = operator==(&p->type_,&local_38);
          SimpleString::~SimpleString(&local_38);
          SimpleString::~SimpleString(&SStack_48);
          if (bVar3) goto LAB_0012789a;
        }
        else {
          SimpleString::~SimpleString(&SStack_48);
        }
        SimpleString::SimpleString(&SStack_48,"long long int");
        bVar3 = operator==(left,&SStack_48);
        if (bVar3) {
          SimpleString::SimpleString(&local_38,"unsigned int");
          bVar3 = operator==(&p->type_,&local_38);
          SimpleString::~SimpleString(&local_38);
          SimpleString::~SimpleString(&SStack_48);
          if (bVar3) goto LAB_0012752d;
        }
        else {
          SimpleString::~SimpleString(&SStack_48);
        }
        SimpleString::SimpleString(&SStack_48,"unsigned int");
        bVar3 = operator==(left,&SStack_48);
        if (bVar3) {
          SimpleString::SimpleString(&local_38,"long long int");
          bVar3 = operator==(&p->type_,&local_38);
          SimpleString::~SimpleString(&local_38);
          SimpleString::~SimpleString(&SStack_48);
          if (bVar3) goto LAB_001274bc;
        }
        else {
          SimpleString::~SimpleString(&SStack_48);
        }
        SimpleString::SimpleString(&SStack_48,"long long int");
        bVar3 = operator==(left,&SStack_48);
        if (bVar3) {
          SimpleString::SimpleString(&local_38,"unsigned long int");
          bVar3 = operator==(&p->type_,&local_38);
          SimpleString::~SimpleString(&local_38);
          SimpleString::~SimpleString(&SStack_48);
          if (bVar3) goto LAB_00127685;
        }
        else {
          SimpleString::~SimpleString(&SStack_48);
        }
        SimpleString::SimpleString(&SStack_48,"unsigned long int");
        bVar3 = operator==(left,&SStack_48);
        if (bVar3) {
          SimpleString::SimpleString(&local_38,"long long int");
          bVar3 = operator==(&p->type_,&local_38);
          SimpleString::~SimpleString(&local_38);
          SimpleString::~SimpleString(&SStack_48);
          if (bVar3) goto LAB_001276f9;
        }
        else {
          SimpleString::~SimpleString(&SStack_48);
        }
        SimpleString::SimpleString(&SStack_48,"long long int");
        bVar3 = operator==(left,&SStack_48);
        if (bVar3) {
          SimpleString::SimpleString(&local_38,"unsigned long long int");
          bVar3 = operator==(&p->type_,&local_38);
          SimpleString::~SimpleString(&local_38);
          SimpleString::~SimpleString(&SStack_48);
          if (bVar3) goto LAB_00127685;
        }
        else {
          SimpleString::~SimpleString(&SStack_48);
        }
        SimpleString::SimpleString(&SStack_48,"unsigned long long int");
        bVar3 = operator==(left,&SStack_48);
        if (bVar3) {
          SimpleString::SimpleString(&local_38,"long long int");
          bVar3 = operator==(&p->type_,&local_38);
          SimpleString::~SimpleString(&local_38);
          SimpleString::~SimpleString(&SStack_48);
          if (bVar3) goto LAB_001276f9;
        }
        else {
          SimpleString::~SimpleString(&SStack_48);
        }
        SimpleString::SimpleString(&SStack_48,"unsigned long long int");
        bVar3 = operator==(left,&SStack_48);
        if (bVar3) {
          SimpleString::SimpleString(&local_38,"int");
          bVar3 = operator==(&p->type_,&local_38);
          SimpleString::~SimpleString(&local_38);
          SimpleString::~SimpleString(&SStack_48);
          if (bVar3) goto LAB_001273d3;
        }
        else {
          SimpleString::~SimpleString(&SStack_48);
        }
        SimpleString::SimpleString(&SStack_48,"int");
        bVar3 = operator==(left,&SStack_48);
        if (bVar3) {
          SimpleString::SimpleString(&local_38,"unsigned long long int");
          bVar3 = operator==(&p->type_,&local_38);
          SimpleString::~SimpleString(&local_38);
          SimpleString::~SimpleString(&SStack_48);
          if (bVar3) goto LAB_00127447;
        }
        else {
          SimpleString::~SimpleString(&SStack_48);
        }
        SimpleString::SimpleString(&SStack_48,"unsigned long long int");
        bVar3 = operator==(left,&SStack_48);
        if (bVar3) {
          SimpleString::SimpleString(&local_38,"unsigned int");
          bVar3 = operator==(&p->type_,&local_38);
          SimpleString::~SimpleString(&local_38);
          SimpleString::~SimpleString(&SStack_48);
          if (bVar3) goto LAB_0012761c;
        }
        else {
          SimpleString::~SimpleString(&SStack_48);
        }
        SimpleString::SimpleString(&SStack_48,"unsigned int");
        bVar3 = operator==(left,&SStack_48);
        if (bVar3) {
          SimpleString::SimpleString(&local_38,"unsigned long long int");
          bVar3 = operator==(&p->type_,&local_38);
          SimpleString::~SimpleString(&local_38);
          SimpleString::~SimpleString(&SStack_48);
          if (bVar3) goto LAB_001275b2;
        }
        else {
          SimpleString::~SimpleString(&SStack_48);
        }
        SimpleString::SimpleString(&SStack_48,"unsigned long long int");
        bVar3 = operator==(left,&SStack_48);
        if (bVar3) {
          SimpleString::SimpleString(&local_38,"long int");
          bVar3 = operator==(&p->type_,&local_38);
          SimpleString::~SimpleString(&local_38);
          SimpleString::~SimpleString(&SStack_48);
          if (bVar3) goto LAB_001276f9;
        }
        else {
          SimpleString::~SimpleString(&SStack_48);
        }
        SimpleString::SimpleString(&SStack_48,"long int");
        bVar3 = operator==(left,&SStack_48);
        if (bVar3) {
          SimpleString::SimpleString(&local_38,"unsigned long long int");
          bVar3 = operator==(&p->type_,&local_38);
          SimpleString::~SimpleString(&local_38);
          SimpleString::~SimpleString(&SStack_48);
          if (bVar3) goto LAB_00127685;
        }
        else {
          SimpleString::~SimpleString(&SStack_48);
        }
        SimpleString::SimpleString(&SStack_48,"unsigned long long int");
        bVar3 = operator==(left,&SStack_48);
        if (bVar3) {
          SimpleString::SimpleString(&local_38,"unsigned long int");
          bVar3 = operator==(&p->type_,&local_38);
          SimpleString::~SimpleString(&local_38);
          SimpleString::~SimpleString(&SStack_48);
          if (bVar3) goto LAB_0012789a;
        }
        else {
          SimpleString::~SimpleString(&SStack_48);
        }
        SimpleString::SimpleString(&SStack_48,"unsigned long int");
        bVar3 = operator==(left,&SStack_48);
        if (bVar3) {
          SimpleString::SimpleString(&local_38,"unsigned long long int");
          bVar3 = operator==(&p->type_,&local_38);
          SimpleString::~SimpleString(&local_38);
          SimpleString::~SimpleString(&SStack_48);
          if (bVar3) goto LAB_0012789a;
        }
        else {
          SimpleString::~SimpleString(&SStack_48);
        }
        bVar3 = operator!=(left,&p->type_);
        if (bVar3) {
          return false;
        }
        SimpleString::SimpleString(&SStack_48,"bool");
        bVar3 = operator==(left,&SStack_48);
        SimpleString::~SimpleString(&SStack_48);
        if (bVar3) {
          return (this->value_).boolValue_ == (p->value_).boolValue_;
        }
        SimpleString::SimpleString(&SStack_48,"int");
        bVar3 = operator==(left,&SStack_48);
        SimpleString::~SimpleString(&SStack_48);
        if (!bVar3) {
          SimpleString::SimpleString(&SStack_48,"unsigned int");
          bVar3 = operator==(left,&SStack_48);
          SimpleString::~SimpleString(&SStack_48);
          if (!bVar3) {
            SimpleString::SimpleString(&SStack_48,"long int");
            bVar3 = operator==(left,&SStack_48);
            SimpleString::~SimpleString(&SStack_48);
            if (!bVar3) {
              SimpleString::SimpleString(&SStack_48,"unsigned long int");
              bVar3 = operator==(left,&SStack_48);
              SimpleString::~SimpleString(&SStack_48);
              if (!bVar3) {
                SimpleString::SimpleString(&SStack_48,"long long int");
                bVar3 = operator==(left,&SStack_48);
                SimpleString::~SimpleString(&SStack_48);
                if (!bVar3) {
                  SimpleString::SimpleString(&SStack_48,"unsigned long long int");
                  bVar3 = operator==(left,&SStack_48);
                  SimpleString::~SimpleString(&SStack_48);
                  if (!bVar3) {
                    SimpleString::SimpleString(&SStack_48,"const char*");
                    bVar3 = operator==(left,&SStack_48);
                    SimpleString::~SimpleString(&SStack_48);
                    if (bVar3) {
                      SimpleString::SimpleString(&SStack_48,(this->value_).stringValue_);
                      SimpleString::SimpleString(&local_38,(p->value_).stringValue_);
                      bVar3 = operator==(&SStack_48,&local_38);
                      SimpleString::~SimpleString(&local_38);
                      SimpleString::~SimpleString(&SStack_48);
                      return bVar3;
                    }
                    SimpleString::SimpleString(&SStack_48,"void*");
                    bVar3 = operator==(left,&SStack_48);
                    SimpleString::~SimpleString(&SStack_48);
                    if (!bVar3) {
                      SimpleString::SimpleString(&SStack_48,"const void*");
                      bVar3 = operator==(left,&SStack_48);
                      SimpleString::~SimpleString(&SStack_48);
                      if (!bVar3) {
                        SimpleString::SimpleString(&SStack_48,"void (*)()");
                        bVar3 = operator==(left,&SStack_48);
                        SimpleString::~SimpleString(&SStack_48);
                        if (!bVar3) {
                          SimpleString::SimpleString(&SStack_48,"double");
                          bVar3 = operator==(left,&SStack_48);
                          SimpleString::~SimpleString(&SStack_48);
                          if (bVar3) {
                            bVar3 = doubles_equal((this->value_).doubleValue_.value,
                                                  (p->value_).doubleValue_.value,
                                                  (this->value_).doubleValue_.tolerance);
                            return bVar3;
                          }
                          SimpleString::SimpleString(&SStack_48,"const unsigned char*");
                          bVar3 = operator==(left,&SStack_48);
                          SimpleString::~SimpleString(&SStack_48);
                          if (bVar3) {
                            if (this->size_ != p->size_) {
                              return false;
                            }
                            iVar4 = SimpleString::MemCmp
                                              ((this->value_).pointerValue_,
                                               (p->value_).pointerValue_,this->size_);
                            return iVar4 == 0;
                          }
                          pMVar2 = this->comparator_;
                          if (pMVar2 == (MockNamedValueComparator *)0x0) {
                            return false;
                          }
                          iVar4 = (*pMVar2->_vptr_MockNamedValueComparator[2])
                                            (pMVar2,(this->value_).longIntValue_,
                                             (p->value_).longIntValue_);
                          return (bool)(char)iVar4;
                        }
                      }
                    }
                  }
                }
              }
            }
LAB_0012789a:
            return (this->value_).longIntValue_ == (p->value_).longIntValue_;
          }
        }
        return (this->value_).intValue_ == (p->value_).intValue_;
      }
      SimpleString::SimpleString(&local_38,"unsigned long int");
      bVar3 = operator==(&p->type_,&local_38);
      SimpleString::~SimpleString(&local_38);
      SimpleString::~SimpleString(&SStack_48);
      if (!bVar3) goto LAB_001276a0;
LAB_00127685:
      bVar3 = -1 < (this->value_).longIntValue_;
      bVar6 = (this->value_).longIntValue_ == (p->value_).longIntValue_;
      goto LAB_0012753d;
    }
    SimpleString::SimpleString(&local_38,"unsigned int");
    bVar3 = operator==(&p->type_,&local_38);
    SimpleString::~SimpleString(&local_38);
    SimpleString::~SimpleString(&SStack_48);
    if (!bVar3) goto LAB_00127559;
LAB_0012752d:
    uVar5 = (this->value_).longIntValue_;
    uVar1 = (p->value_).unsignedIntValue_;
  }
  bVar3 = -1 < (long)uVar5;
  bVar6 = uVar5 == uVar1;
LAB_0012753d:
  return (bool)(bVar6 & bVar3);
}

Assistant:

bool MockNamedValue::equals(const MockNamedValue& p) const
{
    if((type_ == "long int") && (p.type_ == "int"))
        return value_.longIntValue_ == p.value_.intValue_;
    else if((type_ == "int") && (p.type_ == "long int"))
        return value_.intValue_ == p.value_.longIntValue_;
    else if((type_ == "unsigned int") && (p.type_ == "int"))
        return (p.value_.intValue_ >= 0) && (value_.unsignedIntValue_ == (unsigned int)p.value_.intValue_);
    else if((type_ == "int") && (p.type_ == "unsigned int"))
        return (value_.intValue_ >= 0) && ((unsigned int)value_.intValue_ == p.value_.unsignedIntValue_);
    else if((type_ == "unsigned long int") && (p.type_ == "int"))
        return (p.value_.intValue_ >= 0) && (value_.unsignedLongIntValue_ == (unsigned long)p.value_.intValue_);
    else if((type_ == "int") && (p.type_ == "unsigned long int"))
        return (value_.intValue_ >= 0) && ((unsigned long)value_.intValue_ == p.value_.unsignedLongIntValue_);
    else if((type_ == "unsigned int") && (p.type_ == "long int"))
        return (p.value_.longIntValue_ >= 0) && (value_.unsignedIntValue_ == (unsigned long)p.value_.longIntValue_);
    else if((type_ == "long int") && (p.type_ == "unsigned int"))
        return (value_.longIntValue_ >= 0) && ((unsigned long)value_.longIntValue_ == p.value_.unsignedIntValue_);
    else if((type_ == "unsigned int") && (p.type_ == "unsigned long int"))
        return value_.unsignedIntValue_ == p.value_.unsignedLongIntValue_;
    else if((type_ == "unsigned long int") && (p.type_ == "unsigned int"))
        return value_.unsignedLongIntValue_ == p.value_.unsignedIntValue_;
    else if((type_ == "long int") && (p.type_ == "unsigned long int"))
        return (value_.longIntValue_ >= 0) && ((unsigned long)value_.longIntValue_ == p.value_.unsignedLongIntValue_);
    else if((type_ == "unsigned long int") && (p.type_ == "long int"))
        return (p.value_.longIntValue_ >= 0) && (value_.unsignedLongIntValue_ == (unsigned long) p.value_.longIntValue_);
#if CPPUTEST_USE_LONG_LONG
    else if ((type_ == "long long int") && (p.type_ == "int"))
        return value_.longLongIntValue_ == p.value_.intValue_;
    else if ((type_ == "int") && (p.type_ == "long long int"))
        return value_.intValue_ == p.value_.longLongIntValue_;
    else if ((type_ == "long long int") && (p.type_ == "long int"))
        return value_.longLongIntValue_ == p.value_.longIntValue_;
    else if ((type_ == "long int") && (p.type_ == "long long int"))
        return value_.longIntValue_ == p.value_.longLongIntValue_;
    else if ((type_ == "long long int") && (p.type_ == "unsigned int"))
        return (value_.longLongIntValue_ >= 0) && ((unsigned long long)value_.longLongIntValue_ == p.value_.unsignedIntValue_);
    else if ((type_ == "unsigned int") && (p.type_ == "long long int"))
        return (p.value_.longLongIntValue_ >= 0) && (value_.unsignedIntValue_ == (unsigned long long)p.value_.longLongIntValue_);
    else if ((type_ == "long long int") && (p.type_ == "unsigned long int"))
        return (value_.longLongIntValue_ >= 0) && ((unsigned long long)value_.longLongIntValue_ == p.value_.unsignedLongIntValue_);
    else if ((type_ == "unsigned long int") && (p.type_ == "long long int"))
        return (p.value_.longLongIntValue_ >= 0) && (value_.unsignedLongIntValue_ == (unsigned long long)p.value_.longLongIntValue_);
    else if ((type_ == "long long int") && (p.type_ == "unsigned long long int"))
        return (value_.longLongIntValue_ >= 0) && ((unsigned long long)value_.longLongIntValue_ == p.value_.unsignedLongLongIntValue_);
    else if ((type_ == "unsigned long long int") && (p.type_ == "long long int"))
        return (p.value_.longLongIntValue_ >= 0) && (value_.unsignedLongLongIntValue_ == (unsigned long long)p.value_.longLongIntValue_);
    else if ((type_ == "unsigned long long int") && (p.type_ == "int"))
        return (p.value_.intValue_ >= 0) && (value_.unsignedLongLongIntValue_ == (unsigned long long)p.value_.intValue_);
    else if ((type_ == "int") && (p.type_ == "unsigned long long int"))
        return (value_.intValue_ >= 0) && ((unsigned long long)value_.intValue_ == p.value_.unsignedLongLongIntValue_);
    else if ((type_ == "unsigned long long int") && (p.type_ == "unsigned int"))
        return value_.unsignedLongLongIntValue_ == p.value_.unsignedIntValue_;
    else if ((type_ == "unsigned int") && (p.type_ == "unsigned long long int"))
        return value_.unsignedIntValue_ == p.value_.unsignedLongLongIntValue_;
    else if ((type_ == "unsigned long long int") && (p.type_ == "long int"))
        return (p.value_.longIntValue_ >= 0) && (value_.unsignedLongLongIntValue_ == (unsigned long long)p.value_.longIntValue_);
    else if ((type_ == "long int") && (p.type_ == "unsigned long long int"))
        return (value_.longIntValue_ >= 0) && ((unsigned long long)value_.longIntValue_ == p.value_.unsignedLongLongIntValue_);
    else if ((type_ == "unsigned long long int") && (p.type_ == "unsigned long int"))
        return value_.unsignedLongLongIntValue_ == p.value_.unsignedLongIntValue_;
    else if ((type_ == "unsigned long int") && (p.type_ == "unsigned long long int"))
        return value_.unsignedLongIntValue_ == p.value_.unsignedLongLongIntValue_;
#endif

    if (type_ != p.type_) return false;

    if (type_ == "bool")
        return value_.boolValue_ == p.value_.boolValue_;
    else if (type_ == "int")
        return value_.intValue_ == p.value_.intValue_;
    else if (type_ == "unsigned int")
        return value_.unsignedIntValue_ == p.value_.unsignedIntValue_;
    else if (type_ == "long int")
        return value_.longIntValue_ == p.value_.longIntValue_;
    else if (type_ == "unsigned long int")
        return value_.unsignedLongIntValue_ == p.value_.unsignedLongIntValue_;
#if CPPUTEST_USE_LONG_LONG
    else if (type_ == "long long int")
        return value_.longLongIntValue_ == p.value_.longLongIntValue_;
    else if (type_ == "unsigned long long int")
        return value_.unsignedLongLongIntValue_ == p.value_.unsignedLongLongIntValue_;
#endif
    else if (type_ == "const char*")
        return SimpleString(value_.stringValue_) == SimpleString(p.value_.stringValue_);
    else if (type_ == "void*")
        return value_.pointerValue_ == p.value_.pointerValue_;
    else if (type_ == "const void*")
        return value_.constPointerValue_ == p.value_.constPointerValue_;
    else if (type_ == "void (*)()")
        return value_.functionPointerValue_ == p.value_.functionPointerValue_;
    else if (type_ == "double")
        return (doubles_equal(value_.doubleValue_.value, p.value_.doubleValue_.value, value_.doubleValue_.tolerance));
    else if (type_ == "const unsigned char*")
    {
        if (size_ != p.size_) {
            return false;
        }
        return SimpleString::MemCmp(value_.memoryBufferValue_, p.value_.memoryBufferValue_, size_) == 0;
    }

    if (comparator_)
        return comparator_->isEqual(value_.constObjectPointerValue_, p.value_.constObjectPointerValue_);

    return false;
}